

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::TransformerLogLin>::operator()
          (LineStripRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ushort uVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterYs<unsigned_short> *pGVar6;
  TransformerLogLin *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  double dVar14;
  ImPlotContext *pIVar15;
  int iVar16;
  double dVar17;
  ImVec2 IVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  pIVar15 = GImPlot;
  pGVar6 = this->Getter;
  pTVar7 = this->Transformer;
  iVar16 = pGVar6->Count;
  uVar3 = *(ushort *)
           ((long)pGVar6->Ys +
           (long)(((prim + 1 + pGVar6->Offset) % iVar16 + iVar16) % iVar16) * (long)pGVar6->Stride);
  dVar17 = log10(((double)(prim + 1) * pGVar6->XScale + pGVar6->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar15->CurrentPlot;
  dVar14 = (pIVar8->XAxis).Range.Min;
  iVar16 = pTVar7->YAxis;
  IVar1 = pIVar15->PixelRange[iVar16].Min;
  IVar18.x = (float)(pIVar15->Mx *
                     (((double)(float)(dVar17 / pIVar15->LogDenX) *
                       ((pIVar8->XAxis).Range.Max - dVar14) + dVar14) - dVar14) + (double)IVar1.x);
  IVar18.y = (float)(pIVar15->My[iVar16] * ((double)uVar3 - pIVar8->YAxis[iVar16].Range.Min) +
                    (double)IVar1.y);
  fVar19 = (this->P1).x;
  fVar20 = (this->P1).y;
  auVar24._0_4_ = ~-(uint)(IVar18.x <= fVar19) & (uint)IVar18.x;
  auVar24._4_4_ = ~-(uint)(IVar18.y <= fVar20) & (uint)IVar18.y;
  auVar24._8_4_ = ~-(uint)(fVar19 < IVar18.x) & (uint)IVar18.x;
  auVar24._12_4_ = ~-(uint)(fVar20 < IVar18.y) & (uint)IVar18.y;
  auVar12._4_4_ = (uint)fVar20 & -(uint)(IVar18.y <= fVar20);
  auVar12._0_4_ = (uint)fVar19 & -(uint)(IVar18.x <= fVar19);
  auVar12._8_4_ = (uint)fVar19 & -(uint)(fVar19 < IVar18.x);
  auVar12._12_4_ = (uint)fVar20 & -(uint)(fVar20 < IVar18.y);
  auVar24 = auVar24 | auVar12;
  fVar21 = (cull_rect->Min).y;
  auVar13._4_8_ = auVar24._8_8_;
  auVar13._0_4_ = -(uint)(auVar24._4_4_ < fVar21);
  auVar25._0_8_ = auVar13._0_8_ << 0x20;
  auVar25._8_4_ = -(uint)(auVar24._8_4_ < (cull_rect->Max).x);
  auVar25._12_4_ = -(uint)(auVar24._12_4_ < (cull_rect->Max).y);
  auVar26._4_4_ = -(uint)(fVar21 < auVar24._4_4_);
  auVar26._0_4_ = -(uint)((cull_rect->Min).x < auVar24._0_4_);
  auVar26._8_8_ = auVar25._8_8_;
  iVar16 = movmskps((int)pIVar8,auVar26);
  if (iVar16 == 0xf) {
    IVar4 = this->Col;
    IVar1 = *uv;
    fVar21 = IVar18.x - fVar19;
    fVar22 = IVar18.y - fVar20;
    fVar23 = fVar21 * fVar21 + fVar22 * fVar22;
    if (0.0 < fVar23) {
      fVar23 = 1.0 / SQRT(fVar23);
      fVar21 = fVar21 * fVar23;
      fVar22 = fVar22 * fVar23;
    }
    fVar23 = this->Weight * 0.5;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar4;
    fVar21 = fVar23 * fVar21;
    fVar23 = fVar23 * fVar22;
    (pIVar9->pos).x = fVar19 + fVar23;
    (pIVar9->pos).y = fVar20 - fVar21;
    pIVar10[1].pos.x = fVar23 + IVar18.x;
    pIVar10[1].pos.y = IVar18.y - fVar21;
    pIVar10[1].uv = IVar1;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar4;
    pIVar9[2].pos.x = IVar18.x - fVar23;
    pIVar9[2].pos.y = fVar21 + IVar18.y;
    pIVar9[2].uv = IVar1;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar4;
    IVar2 = this->P1;
    pIVar9[3].pos.x = IVar2.x - fVar23;
    pIVar9[3].pos.y = IVar2.y + fVar21;
    pIVar9[3].uv.x = IVar1.x;
    pIVar9[3].uv.y = IVar1.y;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = uVar5;
    puVar11[1] = uVar5 + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar11[3] = uVar5;
    puVar11[4] = uVar5 + 2;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  this->P1 = IVar18;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }